

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::DenselySampledSpectrum::Sample(DenselySampledSpectrum *this,SampledWavelengths *lambda)

{
  array<float,_4> aVar1;
  uint uVar2;
  long lVar3;
  int i;
  long lVar4;
  float fVar5;
  SampledSpectrum s;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    lVar3 = lroundf((lambda->lambda).values[lVar4]);
    uVar2 = (int)lVar3 - this->lambda_min;
    fVar5 = 0.0;
    if ((-1 < (int)uVar2) && ((ulong)uVar2 < (this->values).nStored)) {
      fVar5 = (this->values).ptr[uVar2];
    }
    *(float *)((long)&local_28 + lVar4 * 4) = fVar5;
  }
  aVar1.values[2] = (float)(undefined4)uStack_20;
  aVar1.values[3] = (float)uStack_20._4_4_;
  aVar1.values[0] = (float)(undefined4)local_28;
  aVar1.values[1] = (float)local_28._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i) {
            int offset = std::lround(lambda[i]) - lambda_min;
            if (offset < 0 || offset >= values.size())
                s[i] = 0;
            else
                s[i] = values[offset];
        }
        return s;
    }